

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O0

void __thiscall TasGrid::GridFourier::loadNeededValues(GridFourier *this,double *vals)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> local_30;
  double *local_18;
  double *vals_local;
  GridFourier *this_local;
  
  local_18 = vals;
  vals_local = (double *)this;
  clearGpuCoefficients(this);
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (!bVar1) {
    bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).needed);
    if (!bVar1) {
      StorageSet::addValues
                (&(this->super_BaseCanonicalGrid).values,&(this->super_BaseCanonicalGrid).points,
                 &(this->super_BaseCanonicalGrid).needed,local_18);
      goto LAB_002bade3;
    }
  }
  StorageSet::setValues(&(this->super_BaseCanonicalGrid).values,local_18);
LAB_002bade3:
  acceptUpdatedTensors(this);
  calculateFourierCoefficients(this);
  MultiIndexManipulations::getMaxIndexes(&local_30,&(this->super_BaseCanonicalGrid).points);
  ::std::vector<int,_std::allocator<int>_>::operator=
            (&this->max_power,(vector<int,_std::allocator<int>_> *)&local_30);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&local_30);
  return;
}

Assistant:

void GridFourier::loadNeededValues(const double *vals){
    clearGpuCoefficients(); // changing values and Fourier coefficients, clear the cache
    if (points.empty() || needed.empty()){
        values.setValues(vals);
    }else{
        values.addValues(points, needed, vals);
    }

    acceptUpdatedTensors();
    calculateFourierCoefficients();

    max_power = MultiIndexManipulations::getMaxIndexes(points);
}